

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void glfwSetX11SelectionString(char *string)

{
  Window WVar1;
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    free(_glfw.x11.primarySelectionString);
    _glfw.x11.primarySelectionString = _glfw_strdup(string);
    (*_glfw.x11.xlib.SetSelectionOwner)
              (_glfw.x11.display,_glfw.x11.PRIMARY,_glfw.x11.helperWindowHandle,0);
    WVar1 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,_glfw.x11.PRIMARY);
    if (WVar1 == _glfw.x11.helperWindowHandle) {
      return;
    }
    format = "X11: Failed to become owner of primary selection";
    code = 0x10008;
  }
  _glfwInputError(code,format);
  return;
}

Assistant:

GLFWAPI void glfwSetX11SelectionString(const char* string)
{
    _GLFW_REQUIRE_INIT();

    free(_glfw.x11.primarySelectionString);
    _glfw.x11.primarySelectionString = _glfw_strdup(string);

    XSetSelectionOwner(_glfw.x11.display,
                       _glfw.x11.PRIMARY,
                       _glfw.x11.helperWindowHandle,
                       CurrentTime);

    if (XGetSelectionOwner(_glfw.x11.display, _glfw.x11.PRIMARY) !=
        _glfw.x11.helperWindowHandle)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "X11: Failed to become owner of primary selection");
    }
}